

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O0

void __thiscall
Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>::STDAllocator
          (STDAllocator<unsigned_char,_Diligent::IMemoryAllocator> *this,IMemoryAllocator *Allocator
          ,Char *Description,Char *FileName,Int32 LineNumber)

{
  Int32 LineNumber_local;
  Char *FileName_local;
  Char *Description_local;
  IMemoryAllocator *Allocator_local;
  STDAllocator<unsigned_char,_Diligent::IMemoryAllocator> *this_local;
  
  this->m_Allocator = Allocator;
  this->m_dvpDescription = Description;
  this->m_dvpFileName = FileName;
  this->m_dvpLineNumber = LineNumber;
  return;
}

Assistant:

STDAllocator(AllocatorType& Allocator, const Char* Description, const Char* FileName, const Int32 LineNumber) noexcept :
        // clang-format off
        m_Allocator     {Allocator}
#ifdef DILIGENT_DEVELOPMENT
      , m_dvpDescription{Description}
      , m_dvpFileName   {FileName   }
      , m_dvpLineNumber {LineNumber }
#endif
    // clang-format on
    {
    }